

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

string * number_to_words(string *number_str)

{
  bool bVar1;
  int iVar2;
  ulong in_RSI;
  string *in_RDI;
  exception *e;
  char digit;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string decimal_part;
  int thousands;
  int millions;
  int billions;
  int int_number;
  string integer_part;
  size_t decimal_pos;
  string *result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe18;
  mapped_type *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  string *__k;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  string *local_168;
  string local_160 [12];
  int in_stack_fffffffffffffeac;
  string local_140 [32];
  string local_120 [32];
  string local_100 [36];
  int local_dc;
  string local_d8 [32];
  string local_b8 [36];
  int local_94;
  string local_90 [32];
  string local_70 [32];
  int local_50;
  undefined1 local_49;
  int local_48;
  string local_38 [32];
  long local_18;
  ulong local_10;
  
  this = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
  __k = in_RDI;
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find((char)in_RSI,0x2e);
  std::__cxx11::string::substr((ulong)local_38,local_10);
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffe20,(size_t *)in_stack_fffffffffffffe18,0);
  local_49 = 0;
  local_48 = iVar2;
  std::__cxx11::string::string((string *)in_RDI);
  if (local_48 == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"zero");
  }
  else {
    if (999999999 < local_48) {
      local_50 = local_48 / 1000000000;
      convert_less_than_thousand_abi_cxx11_(in_stack_fffffffffffffeac);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_fffffffffffffe28),(char *)in_stack_fffffffffffffe20);
      std::__cxx11::string::operator+=((string *)in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      local_48 = local_48 % 1000000000;
    }
    if (999999 < local_48) {
      local_94 = local_48 / 1000000;
      convert_less_than_thousand_abi_cxx11_(in_stack_fffffffffffffeac);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_fffffffffffffe28),(char *)in_stack_fffffffffffffe20);
      std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_d8);
      local_48 = local_48 % 1000000;
    }
    if (999 < local_48) {
      local_dc = local_48 / 1000;
      convert_less_than_thousand_abi_cxx11_(in_stack_fffffffffffffeac);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_fffffffffffffe28),(char *)in_stack_fffffffffffffe20);
      std::__cxx11::string::operator+=((string *)in_RDI,local_100);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_120);
      local_48 = local_48 % 1000;
    }
    if (0 < local_48) {
      convert_less_than_thousand_abi_cxx11_(in_stack_fffffffffffffeac);
      std::__cxx11::string::operator+=((string *)in_RDI,local_140);
      std::__cxx11::string::~string(local_140);
    }
  }
  if (local_18 != -1) {
    std::__cxx11::string::operator+=((string *)in_RDI," point");
    std::__cxx11::string::substr((ulong)local_160,local_10);
    local_168 = local_160;
    local_170._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1) {
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_170);
      in_stack_fffffffffffffe20 =
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this,(key_type *)__k);
      std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffe60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe60);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_170);
    }
    std::__cxx11::string::~string(local_160);
  }
  local_49 = 1;
  std::__cxx11::string::~string(local_38);
  return __k;
}

Assistant:

static std::string number_to_words(const std::string & number_str) {
    try {
        size_t decimal_pos = number_str.find('.');
        std::string integer_part = number_str.substr(0, decimal_pos);

        int int_number = std::stoi(integer_part);
        std::string result;

        if (int_number == 0) {
            result = "zero";
        } else {
            if (int_number >= 1000000000) {
                int billions = int_number / 1000000000;
                result += convert_less_than_thousand(billions) + " billion ";
                int_number %= 1000000000;
            }

            if (int_number >= 1000000) {
                int millions = int_number / 1000000;
                result += convert_less_than_thousand(millions) + " million ";
                int_number %= 1000000;
            }

            if (int_number >= 1000) {
                int thousands = int_number / 1000;
                result += convert_less_than_thousand(thousands) + " thousand ";
                int_number %= 1000;
            }

            if (int_number > 0) {
                result += convert_less_than_thousand(int_number);
            }
        }

        // Handle decimal part
        if (decimal_pos != std::string::npos) {
            result += " point";
            std::string decimal_part = number_str.substr(decimal_pos + 1);
            for (char digit : decimal_part) {
                result += " " + ones.at(digit - '0');
            }
        }

        return result;
    } catch (const std::exception& e) {
        // Skip if fails
        return " ";
    }
}